

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O3

Gia_Man_t * Gia_ManCofTest(Gia_Man_t *pGia,int nFrameMax,int nConfMax,int nTimeMax,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Ccf_Man_t *p;
  Gia_Man_t *pGVar6;
  Gia_Man_t *pGVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  timespec ts;
  timespec local_58;
  int local_48;
  uint local_44;
  long local_40;
  long local_38;
  
  iVar2 = clock_gettime(3,&local_58);
  if (iVar2 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  iVar2 = clock_gettime(3,&local_58);
  if (iVar2 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  if (pGia->vCos->nSize - pGia->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(pGia) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCCof.c"
                  ,0x112,"Gia_Man_t *Gia_ManCofTest(Gia_Man_t *, int, int, int, int)");
  }
  lVar13 = lVar13 + (long)nTimeMax * 1000000;
  local_44 = nTimeMax;
  p = Ccf_ManStart(pGia,nFrameMax,nConfMax,nTimeMax,fVerbose);
  if (nTimeMax != 0) {
    p->pSat->nRuntimeLimit = lVar13;
  }
  local_38 = lVar8;
  if (nFrameMax < 1) {
    bVar15 = true;
    iVar2 = -1;
    uVar14 = 0;
  }
  else {
    uVar12 = 0;
    local_48 = 0;
    local_40 = lVar13;
    do {
      uVar14 = (ulong)uVar12;
      if (fVerbose != 0) {
        printf("ITER %3d :\n",uVar14);
      }
      uVar12 = uVar12 + 1;
      pGVar6 = (Gia_Man_t *)Gia_ManUnrollAdd(p->pUnr,uVar12);
      p->pFrames = pGVar6;
      Gia_ManCofExtendSolver(p);
      iVar2 = Gia_ManUnrollLastLit(p->pUnr);
      iVar2 = Gia_ManCofGetReachable(p,iVar2);
      if (iVar2 != 0) goto LAB_0070fe7e;
      Gia_ManSetPhase(p->pFrames);
      pGVar6 = p->pFrames;
      uVar1 = pGVar6->vCos->nSize;
      iVar2 = 0;
      uVar3 = uVar1 - pGVar6->nRegs;
      if (uVar3 == 0 || (int)uVar1 < pGVar6->nRegs) {
        uVar9 = 0;
LAB_0070fe53:
        if ((int)uVar9 < (int)uVar3) goto LAB_0070fe7e;
      }
      else {
        uVar10 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar10 = 0;
        }
        uVar9 = 0;
        do {
          if (uVar10 == uVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar5 = pGVar6->vCos->pArray[uVar9];
          if (((long)iVar5 < 0) || (pGVar6->nObjs <= iVar5)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar6->pObjs == (Gia_Obj_t *)0x0) goto LAB_0070fe53;
          if (*(long *)(pGVar6->pObjs + iVar5) < 0) {
            printf("Property failed in frame %d.\n",uVar14);
            uVar3 = p->pFrames->vCos->nSize - p->pFrames->nRegs;
            local_48 = 1;
            goto LAB_0070fe53;
          }
          uVar9 = uVar9 + 1;
        } while (uVar3 != uVar9);
      }
    } while (uVar12 != nFrameMax);
    iVar2 = 0;
    uVar14 = (ulong)(uint)nFrameMax;
LAB_0070fe7e:
    bVar15 = local_48 == 0;
    lVar13 = local_40;
  }
  uVar12 = local_44;
  iVar5 = (int)uVar14;
  if (lVar13 != 0) {
    iVar4 = clock_gettime(3,&local_58);
    if (iVar4 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    if (lVar13 < lVar8) {
      printf("Runtime limit (%d sec) is reached after %d frames.  ",(ulong)uVar12,uVar14);
      goto LAB_0070ff4a;
    }
  }
  if (iVar5 == nFrameMax) {
    pcVar11 = "Completed %d frames without converging.  ";
  }
  else {
    if (iVar2 != -1) {
      if (iVar2 == 1) {
        printf("Backward reachability converged after %d iterations.  ",(ulong)(iVar5 - 1));
      }
      goto LAB_0070ff4a;
    }
    nFrameMax = iVar5 - 1;
    pcVar11 = "Conflict limit or timeout is reached after %d frames.  ";
  }
  printf(pcVar11,(ulong)(uint)nFrameMax);
LAB_0070ff4a:
  iVar4 = 3;
  iVar5 = clock_gettime(3,&local_58);
  if (iVar5 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  lVar13 = lVar13 + local_38;
  Abc_Print(iVar4,"%s =","Runtime");
  Abc_Print(iVar4,"%9.2f sec\n",(double)lVar13 / 1000000.0);
  if (bVar15) {
    pcVar11 = "Property is undecided.";
    if (iVar2 == 1) {
      pcVar11 = "Property holds.";
    }
    puts(pcVar11);
  }
  Gia_ManHashStop(p->pFrames);
  pGVar6 = p->pFrames;
  p->pFrames = (Gia_Man_t *)0x0;
  Ccf_ManStop(p);
  pGVar7 = Gia_ManCleanup(pGVar6);
  Gia_ManStop(pGVar6);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManCofTest( Gia_Man_t * pGia, int nFrameMax, int nConfMax, int nTimeMax, int fVerbose )
{ 
    Gia_Man_t * pNew;
    Ccf_Man_t * p;
    Gia_Obj_t * pObj;
    int f, i, Lit, RetValue = -1, fFailed = 0;
    abctime nTimeToStop = Abc_Clock() + nTimeMax * CLOCKS_PER_SEC;
    abctime clk = Abc_Clock();
    assert( Gia_ManPoNum(pGia) == 1 );

    // create reachability manager
    p = Ccf_ManStart( pGia, nFrameMax, nConfMax, nTimeMax, fVerbose );

    // set runtime limit
    if ( nTimeMax )
        sat_solver_set_runtime_limit( p->pSat, nTimeToStop );

    // perform backward image computation
    for ( f = 0; f < nFrameMax; f++ )
    {
        if ( fVerbose ) 
            printf( "ITER %3d :\n", f );
        // add to the mapping of nodes
        p->pFrames = (Gia_Man_t *)Gia_ManUnrollAdd( p->pUnr, f+1 );
        // add SAT clauses
        Gia_ManCofExtendSolver( p );
        // return output literal
        Lit = Gia_ManUnrollLastLit( p->pUnr );
        // derives cofactors of the property literal till all states are blocked
        RetValue = Gia_ManCofGetReachable( p, Lit );
        if ( RetValue )
            break;

        // check the property output
        Gia_ManSetPhase( p->pFrames );
        Gia_ManForEachPo( p->pFrames, pObj, i )
            if ( pObj->fPhase )
            {
                printf( "Property failed in frame %d.\n", f );
                fFailed = 1;
                break;
            }
        if ( i < Gia_ManPoNum(p->pFrames) )
            break;
    }

    // report the result
    if ( nTimeToStop && Abc_Clock() > nTimeToStop )
        printf( "Runtime limit (%d sec) is reached after %d frames.  ", nTimeMax, f );
    else if ( f == nFrameMax )
        printf( "Completed %d frames without converging.  ", f );
    else if ( RetValue == 1 )
        printf( "Backward reachability converged after %d iterations.  ", f-1 );
    else if ( RetValue == -1 )
        printf( "Conflict limit or timeout is reached after %d frames.  ", f-1 );
    Abc_PrintTime( 1, "Runtime", Abc_Clock() - clk );

    if ( !fFailed && RetValue == 1 )
        printf( "Property holds.\n" );
    else if ( !fFailed )
        printf( "Property is undecided.\n" );

    // get the resulting AIG manager
    Gia_ManHashStop( p->pFrames );
    pNew = p->pFrames;  p->pFrames = NULL;
    Ccf_ManStop( p );

    // cleanup
//    if ( fVerbose )
//        Gia_ManPrintStats( pNew, 0 );
    pNew = Gia_ManCleanup( pGia = pNew );
    Gia_ManStop( pGia );
//    if ( fVerbose )
//        Gia_ManPrintStats( pNew, 0 );
    return pNew;   
}